

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O2

void trt_pose::parse::munkresStep1
               (float *cost_graph,int M,PairGraph *star_graph,int nrows,int ncols)

{
  pointer piVar1;
  pointer piVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int j;
  ulong uVar6;
  
  uVar3 = 0;
  uVar5 = (ulong)(uint)ncols;
  if (ncols < 1) {
    uVar5 = uVar3;
  }
  uVar4 = (ulong)(uint)nrows;
  if (nrows < 1) {
    uVar4 = uVar3;
  }
  for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    piVar1 = (star_graph->rows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (star_graph->cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      if ((((piVar1[uVar3] < 0) && (piVar2[uVar6] < 0)) && (cost_graph[uVar6] == 0.0)) &&
         (!NAN(cost_graph[uVar6]))) {
        piVar1[uVar3] = (int)uVar6;
        piVar2[uVar6] = (int)uVar3;
      }
    }
    cost_graph = cost_graph + M;
  }
  return;
}

Assistant:

void munkresStep1(const float *cost_graph, const int M, PairGraph &star_graph,
                  const int nrows, const int ncols) {
  for (int i = 0; i < nrows; i++) {
    for (int j = 0; j < ncols; j++) {
      if (!star_graph.isRowSet(i) && !star_graph.isColSet(j) &&
          (cost_graph[i * M + j] == 0)) {
        star_graph.set(i, j);
      }
    }
  }
}